

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::ConditionalRenderInverted::CoverageTest::iterate(CoverageTest *this)

{
  bool bVar1;
  RenderContext *pRVar2;
  ContextInfo *this_00;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  uint local_30;
  GLuint i;
  byte local_1f;
  byte local_1e;
  undefined1 local_1d;
  deUint32 local_1c;
  bool is_error;
  bool is_ok;
  ApiType AStack_18;
  bool is_arb_conditional_render_inverted;
  byte local_11;
  CoverageTest *pCStack_10;
  bool is_at_least_gl_45;
  CoverageTest *this_local;
  
  pCStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_18.m_bits = (*pRVar2->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::core(4,5);
  local_11 = glu::contextSupports((ContextType)AStack_18.m_bits,(ApiType)local_1c);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_1d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_conditional_render_inverted");
  local_1e = 1;
  local_1f = 0;
  if (((local_11 & 1) != 0) || ((bool)local_1d)) {
    createQueryObject(this);
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      bVar1 = test(this,iterate::modes[local_30]);
      local_1e = (local_1e & 1 & bVar1) != 0;
    }
  }
  clean(this);
  if ((local_1e & 1) == 0) {
    if ((local_1f & 1) == 0) {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_330,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_330,
                          (char (*) [58])"The Conditional Render Inverted Coverage Test has failed."
                         );
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_330);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_1b0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_1b0,
                          (char (*) [77])
                          "Internal error has occured during Conditional Render Inverted Coverage Test."
                         );
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_INTERNAL_ERROR,"Test error.");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl4cts::ConditionalRenderInverted::CoverageTest::iterate()
{
	/* OpenGL support query. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_conditional_render_inverted =
		m_context.getContextInfo().isExtensionSupported("GL_ARB_conditional_render_inverted");

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* This test should only be executed if we're running a GL4.5 context or related extension is available */
	try
	{
		if (is_at_least_gl_45 || is_arb_conditional_render_inverted)
		{
			/* Prepare common objects. */
			createQueryObject();

			/* Test cases. */
			static const glw::GLenum modes[] = { GL_QUERY_WAIT_INVERTED, GL_QUERY_NO_WAIT_INVERTED,
												 GL_QUERY_BY_REGION_WAIT_INVERTED,
												 GL_QUERY_BY_REGION_NO_WAIT_INVERTED };

			static const glw::GLuint modes_count = sizeof(modes) / sizeof(modes[0]);

			/* Iterate over the test cases. */
			for (glw::GLuint i = 0; i < modes_count; ++i)
			{
				is_ok &= test(modes[i]);
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Internal error has occured during Conditional Render Inverted Coverage Test."
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Test error.");
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "The Conditional Render Inverted Coverage Test has failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}